

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RepeatedField<float> *
google::protobuf::Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>(Arena *arena)

{
  RepeatedField<float> *pRVar1;
  
  if (arena != (Arena *)0x0) {
    pRVar1 = DoCreateMessage<google::protobuf::RepeatedField<float>>(arena);
    return pRVar1;
  }
  pRVar1 = (RepeatedField<float> *)operator_new(0x10);
  RepeatedField<float>::RepeatedField(pRVar1,(Arena *)0x0);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArenaCompatible(Arena* PROTOBUF_NULLABLE arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }